

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O0

CopyPtr<slang::SVQueue> * __thiscall
slang::CopyPtr<slang::SVQueue>::operator=
          (CopyPtr<slang::SVQueue> *this,CopyPtr<slang::SVQueue> *other)

{
  SVQueue *pSVar1;
  CopyPtr<slang::SVQueue> *in_RSI;
  CopyPtr<slang::SVQueue> *in_RDI;
  void **in_stack_ffffffffffffffc8;
  SVQueue **in_stack_ffffffffffffffd0;
  
  if (in_RDI != in_RSI) {
    if (in_RDI->ptr != (SVQueue *)0x0) {
      SVQueue::~SVQueue((SVQueue *)0x4f7d4c);
      operator_delete(in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    }
    pSVar1 = std::exchange<slang::SVQueue*,decltype(nullptr)>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_RDI->ptr = pSVar1;
  }
  return in_RDI;
}

Assistant:

CopyPtr& operator=(CopyPtr&& other) noexcept {
        if (this != &other) {
            delete ptr;
            ptr = std::exchange(other.ptr, nullptr);
        }
        return *this;
    }